

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O0

vec2f __thiscall MT19937Sampler::sampleUnitDisk(MT19937Sampler *this)

{
  undefined8 *in_RDI;
  float fVar1;
  float fVar2;
  float y;
  float x;
  vec2f local_8;
  
  do {
    fVar1 = (float)(**(code **)*in_RDI)();
    fVar1 = fVar1 + fVar1 + -1.0;
    fVar2 = (float)(**(code **)*in_RDI)();
    fVar2 = fVar2 + fVar2 + -1.0;
  } while (1.0 < fVar1 * fVar1 + fVar2 * fVar2);
  vec2f::vec2f(&local_8,fVar1,fVar2);
  return local_8;
}

Assistant:

vec2f sampleUnitDisk() {
		float x,y;
		do {
			x = get1f()*2-1;
			y = get1f()*2-1;
		}
		while (x*x+y*y>1);
		return vec2f(x,y);
	}